

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

int __thiscall
luna::Function::AddUpvalue(Function *this,String *name,bool parent_local,int register_index)

{
  UpvalueInfo local_18;
  
  local_18.name_ = name;
  local_18.parent_local_ = parent_local;
  local_18.register_index_ = register_index;
  std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>::
  emplace_back<luna::Function::UpvalueInfo>(&this->upvalues_,&local_18);
  return (int)((ulong)((long)(this->upvalues_).
                             super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->upvalues_).
                            super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
}

Assistant:

int Function::AddUpvalue(String *name, bool parent_local, int register_index)
    {
        upvalues_.push_back(UpvalueInfo(name, parent_local, register_index));
        return upvalues_.size() - 1;
    }